

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

CallInfo * luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  CallInfo *pCVar5;
  StkId pSVar6;
  int iVar7;
  ulong uVar8;
  
  while( true ) {
    bVar4 = (func->val).tt_ & 0x3f;
    if (bVar4 == 6) {
      lVar2 = *(long *)((func->val).value_.f + 0x18);
      uVar8 = (L->top).offset - (long)func;
      bVar4 = *(byte *)(lVar2 + 10);
      bVar1 = *(byte *)(lVar2 + 0xc);
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)(ulong)bVar1) {
        lVar3 = (L->stack).offset;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,(uint)bVar1,1);
        func = (StkId)(((long)func - lVar3) + (long)(L->stack).p);
      }
      pCVar5 = prepCallInfo(L,func,nresults,0,func + (ulong)bVar1 + 1);
      L->ci = pCVar5;
      (pCVar5->u).l.savedpc = *(Instruction **)(lVar2 + 0x40);
      for (iVar7 = (int)(uVar8 >> 4) + -1; iVar7 < (int)(uint)bVar4; iVar7 = iVar7 + 1) {
        lVar2 = (L->top).offset;
        (L->top).p = (StkId)(lVar2 + 0x10);
        *(undefined1 *)(lVar2 + 8) = 0;
      }
      return pCVar5;
    }
    pSVar6 = func;
    if (bVar4 == 0x16) break;
    if (bVar4 == 0x26) {
      pSVar6 = (StkId)((func->val).value_.f + 0x18);
      break;
    }
    func = tryfuncTM(L,func);
  }
  precallC(L,func,nresults,(pSVar6->val).value_.f);
  return (CallInfo *)0x0;
}

Assistant:

CallInfo *luaD_precall (lua_State *L, StkId func, int nresults) {
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      precallC(L, func, nresults, clCvalue(s2v(func))->f);
      return NULL;
    case LUA_VLCF:  /* light C function */
      precallC(L, func, nresults, fvalue(s2v(func)));
      return NULL;
    case LUA_VLCL: {  /* Lua function */
      CallInfo *ci;
      Proto *p = clLvalue(s2v(func))->p;
      int narg = cast_int(L->top.p - func) - 1;  /* number of real arguments */
      int nfixparams = p->numparams;
      int fsize = p->maxstacksize;  /* frame size */
      checkstackGCp(L, fsize, func);
      L->ci = ci = prepCallInfo(L, func, nresults, 0, func + 1 + fsize);
      ci->u.l.savedpc = p->code;  /* starting point */
      for (; narg < nfixparams; narg++)
        setnilvalue(s2v(L->top.p++));  /* complete missing arguments */
      lua_assert(ci->top.p <= L->stack_last.p);
      return ci;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* try to get '__call' metamethod */
      /* return luaD_precall(L, func, nresults); */
      goto retry;  /* try again with metamethod */
    }
  }
}